

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
AddData<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtree *this,CordRepBtree *tree,string_view data,size_t extra)

{
  int iVar1;
  bool bVar2;
  undefined1 auVar3 [12];
  CordRepBtree *pCVar4;
  CordRepBtree *pCVar5;
  Action AVar6;
  size_type __n;
  CordRepBtree **ppCVar7;
  uint uVar8;
  ulong uVar9;
  size_t delta;
  uint depth;
  OpResult result;
  OpResult OVar10;
  string_view sVar11;
  OpResult OVar12;
  basic_string_view<char,_std::char_traits<char>_> bVar13;
  string_view data_00;
  OpResult result_00;
  OpResult result_01;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> ops;
  
  sVar11._M_str = (char *)data._M_len;
  if (tree == (CordRepBtree *)0x0) {
    return this;
  }
  depth = (uint)(this->super_CordRep).storage[0];
  pCVar4 = cord_internal::anon_unknown_0::
           StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::BuildStack
                     (&ops,this,depth);
  if ((ulong)(pCVar4->super_CordRep).storage[2] - (ulong)(pCVar4->super_CordRep).storage[1] < 6) {
    OVar10 = ToOpResult(pCVar4,(int)depth < ops.share_depth);
    pCVar5 = OVar10.tree;
    uVar9 = (ulong)OVar10.action;
    auVar3 = OVar10._0_12_;
    OVar10._12_4_ = 0;
    OVar10.tree = (CordRepBtree *)auVar3._0_8_;
    OVar10.action = auVar3._8_4_;
    sVar11._M_len = (size_t)tree;
    sVar11 = AddData<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                       (pCVar5,sVar11,(size_t)data._M_str);
    pCVar4 = (CordRepBtree *)sVar11._M_len;
    if (pCVar4 == (CordRepBtree *)0x0) {
      (pCVar5->super_CordRep).length =
           (size_t)((tree->super_CordRep).storage + ((pCVar5->super_CordRep).length - 0xd));
      goto LAB_00d0af56;
    }
    delta = (long)tree - (long)pCVar4;
    if (delta == 0) {
      __assert_fail("delta > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                    ,0x279,
                    "static CordRepBtree *absl::cord_internal::CordRepBtree::AddData(CordRepBtree *, absl::string_view, size_t) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                   );
    }
    (pCVar5->super_CordRep).length = (pCVar5->super_CordRep).length + delta;
    OVar12._12_4_ = 0;
    OVar12.tree = (CordRepBtree *)auVar3._0_8_;
    OVar12.action = auVar3._8_4_;
    if (depth != 0) {
      ppCVar7 = ops.stack + ((ulong)(depth - 1) - 1);
      uVar9 = (ulong)depth;
      OVar12 = OVar10;
      do {
        pCVar5 = ops.stack[uVar9 - 1];
        AVar6 = OVar12.action;
        if (AVar6 == kCopied) {
          OVar12 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                             (pCVar5,(long)uVar9 <= (long)ops.share_depth,
                              &(OVar12.tree)->super_CordRep,delta);
          ops.stack[uVar9 - 1] = OVar12.tree;
        }
        else {
          if (AVar6 == kSelf) goto LAB_00d0ae7d;
          if (AVar6 == kPopped) {
            __assert_fail("!propagate",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0x145,
                          "CordRepBtree *absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kFront>::Unwind(CordRepBtree *, int, size_t, OpResult) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront, propagate = true]"
                         );
          }
        }
        ppCVar7 = ppCVar7 + 0xffffffffffffffff;
        bVar2 = 1 < uVar9;
        uVar9 = uVar9 - 1;
      } while (bVar2);
    }
    result.tree = OVar12._8_8_;
    result._8_8_ = OVar12.tree;
    pCVar5 = cord_internal::anon_unknown_0::
             StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::Finalize
                       ((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         *)this,result._8_8_,result);
    goto LAB_00d0ae86;
  }
LAB_00d0af22:
  while( true ) {
    data_00._M_str = sVar11._M_str;
    data_00._M_len = (size_t)tree;
    pCVar5 = NewLeaf<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                       (data_00,(size_t)data._M_str);
    __n = (long)tree - (pCVar5->super_CordRep).length;
    if (__n == 0) break;
    local_a8._M_len = (size_t)tree;
    local_a8._M_str = sVar11._M_str;
    bVar13 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_a8,0,__n);
    sVar11._M_str = bVar13._M_str;
    tree = (CordRepBtree *)bVar13._M_len;
    result_00._8_8_ = 2;
    result_00.tree = pCVar5;
    this = cord_internal::anon_unknown_0::
           StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::
           Unwind<false>(&ops,this,depth,(pCVar5->super_CordRep).length,result_00);
    depth = (uint)(this->super_CordRep).storage[0];
    if (0xb < depth) {
      __assert_fail("height <= CordRepBtree::kMaxHeight",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                    ,0x103,
                    "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kFront>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                   );
    }
    pCVar4 = this;
    for (uVar9 = 0; iVar1 = (pCVar4->super_CordRep).refcount.count_.super___atomic_base<int>._M_i,
        depth != uVar9; uVar9 = uVar9 + 1) {
      if (iVar1 != 2) {
        __assert_fail("tree->refcount.IsOne()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                      ,0x106,
                      "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kFront>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                     );
      }
      ops.stack[uVar9] = pCVar4;
      pCVar4 = CordRep::btree(pCVar4->edges_[(pCVar4->super_CordRep).storage[1]]);
    }
    if (iVar1 != 2) {
      __assert_fail("tree->refcount.IsOne()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                    ,0x10a,
                    "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kFront>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                   );
    }
    ops.share_depth = depth + 1;
  }
  uVar9 = 2;
LAB_00d0af56:
  result_01._8_8_ = uVar9;
  result_01.tree = pCVar5;
  pCVar4 = cord_internal::anon_unknown_0::
           StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::
           Unwind<false>(&ops,this,depth,(size_t)tree,result_01);
  return pCVar4;
LAB_00d0ae7d:
  while( true ) {
    uVar8 = (int)uVar9 - 1;
    uVar9 = (ulong)uVar8;
    (pCVar5->super_CordRep).length = (pCVar5->super_CordRep).length + delta;
    if ((int)uVar8 < 1) break;
    pCVar5 = *ppCVar7;
    ppCVar7 = ppCVar7 + 0xffffffffffffffff;
  }
LAB_00d0ae86:
  ops.share_depth = depth + 1;
  tree = pCVar4;
  this = pCVar5;
  goto LAB_00d0af22;
}

Assistant:

CordRepBtree* CordRepBtree::AddData(CordRepBtree* tree, absl::string_view data,
                                    size_t extra) {
  if (ABSL_PREDICT_FALSE(data.empty())) return tree;

  const size_t original_data_size = data.size();
  int depth = tree->height();
  StackOperations<edge_type> ops;
  CordRepBtree* leaf = ops.BuildStack(tree, depth);

  // If there is capacity in the last edge, append as much data
  // as possible into this last edge.
  if (leaf->size() < leaf->capacity()) {
    OpResult result = leaf->ToOpResult(ops.owned(depth));
    data = result.tree->AddData<edge_type>(data, extra);
    if (data.empty()) {
      result.tree->length += original_data_size;
      return ops.Unwind(tree, depth, original_data_size, result);
    }

    // We added some data into this leaf, but not all. Propagate the added
    // length to the top most node, and rebuild the stack with any newly copied
    // or updated nodes. From this point on, the path (leg) from the top most
    // node to the right-most node towards the leaf node is privately owned.
    size_t delta = original_data_size - data.size();
    assert(delta > 0);
    result.tree->length += delta;
    tree = ops.Propagate(tree, depth, delta, result);
    ops.share_depth = depth + 1;
  }

  // We were unable to append all data into the existing right-most leaf node.
  // This means all remaining data must be put into (a) new leaf node(s) which
  // we append to the tree. To make this efficient, we iteratively build full
  // leaf nodes from `data` until the created leaf contains all remaining data.
  // We utilize the `Unwind` method to merge the created leaf into the first
  // level towards root that has capacity. On each iteration with remaining
  // data, we rebuild the stack in the knowledge that right-most nodes are
  // privately owned after the first `Unwind` completes.
  for (;;) {
    OpResult result = {CordRepBtree::NewLeaf<edge_type>(data, extra), kPopped};
    if (result.tree->length == data.size()) {
      return ops.Unwind(tree, depth, result.tree->length, result);
    }
    data = Consume<edge_type>(data, result.tree->length);
    tree = ops.Unwind(tree, depth, result.tree->length, result);
    depth = tree->height();
    ops.BuildOwnedStack(tree, depth);
  }
}